

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O1

cmd_ln_val_t * cmd_ln_val_init(int t,char *name,char *str)

{
  anytype_t *val;
  anytype_t *paVar1;
  char *pcVar2;
  
  val = (anytype_t *)
        __ckd_calloc__(1,0x18,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                       ,0x9d);
  paVar1 = anytype_from_str(val,t,str);
  if (paVar1 == (anytype_t *)0x0) {
    ckd_free(val);
    val = (anytype_t *)0x0;
  }
  else {
    *(int *)(val + 1) = t;
    pcVar2 = __ckd_salloc__(name,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                            ,0xa3);
    val[2].ptr = pcVar2;
  }
  return (cmd_ln_val_t *)val;
}

Assistant:

cmd_ln_val_t *
cmd_ln_val_init(int t, const char *name, const char *str)
{
    cmd_ln_val_t *v;

    v = ckd_calloc(1, sizeof(*v));
    if (anytype_from_str(&v->val, t, str) == NULL) {
        ckd_free(v);
        return NULL;
    }
    v->type = t;
    v->name = ckd_salloc(name);

    return v;
}